

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::raise_file_error<std::error_code,char_const*,std::__cxx11::string>
          (_anonymous_namespace_ *this,error_code err,char *message,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *what;
  error_code erc;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  _Var2;
  error_category local_208 [32];
  ulong local_1e8;
  undefined8 uStack_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  undefined8 local_1c8;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_1c0 [2];
  ostringstream local_1a0 [8];
  ostringstream str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path_local;
  char *message_local;
  error_code err_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,(char *)err._M_cat);
  poVar1 = std::operator<<(poVar1,' ');
  _Var2 = pstore::quoted((string *)message);
  what = _Var2._M_string;
  local_1c8._0_2_ = _Var2._8_2_;
  local_1c0[0]._M_delim = (char)local_1c8;
  local_1c0[0]._M_escape = local_1c8._1_1_;
  local_1d0 = what;
  local_1c8 = _Var2._8_8_;
  local_1c0[0]._M_string = what;
  std::__detail::operator<<(poVar1,local_1c0);
  local_1e8 = CONCAT44(message_local._4_4_,(int)this);
  uStack_1e0 = err._0_8_;
  std::__cxx11::ostringstream::str();
  erc._M_cat = local_208;
  erc._0_8_ = uStack_1e0;
  pstore::raise_error_code<std::error_code,std::__cxx11::string>
            ((pstore *)(local_1e8 & 0xffffffff),erc,what);
}

Assistant:

PSTORE_NO_RETURN void raise_file_error (ErrorCode err, MessageStr const message,
                                            PathStr const path) {
        std::ostringstream str;
        str << message << ' ' << pstore::quoted (path);
        pstore::raise_error_code (err, str.str ());
    }